

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O0

void __thiscall
icu_63::Norms::reorder(Norms *this,UnicodeString *mapping,BuilderReorderingBuffer *buffer)

{
  uint8_t cc;
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  int iVar4;
  uint local_38;
  int iStack_34;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  char16_t *s;
  int32_t length;
  BuilderReorderingBuffer *buffer_local;
  UnicodeString *mapping_local;
  Norms *this_local;
  
  iVar2 = UnicodeString::length(mapping);
  pcVar3 = UnicodeString::getBuffer(mapping);
  iStack_34 = 0;
  while (iStack_34 < iVar2) {
    iVar4 = iStack_34 + 1;
    local_38 = (uint)(ushort)pcVar3[iStack_34];
    if ((((local_38 & 0xfffffc00) == 0xd800) && (iVar4 != iVar2)) &&
       ((pcVar3[iVar4] & 0xfc00U) == 0xdc00)) {
      local_38 = local_38 * 0x400 + (uint)(ushort)pcVar3[iVar4] + 0xfca02400;
      iVar4 = iStack_34 + 2;
    }
    iStack_34 = iVar4;
    cc = getCC(this,local_38);
    BuilderReorderingBuffer::append(buffer,local_38,cc);
  }
  UVar1 = BuilderReorderingBuffer::didReorder(buffer);
  if (UVar1 != '\0') {
    BuilderReorderingBuffer::toString(buffer,mapping);
  }
  return;
}

Assistant:

void Norms::reorder(UnicodeString &mapping, BuilderReorderingBuffer &buffer) const {
    int32_t length=mapping.length();
    U_ASSERT(length<=Normalizer2Impl::MAPPING_LENGTH_MASK);
    const char16_t *s=mapping.getBuffer();
    int32_t i=0;
    UChar32 c;
    while(i<length) {
        U16_NEXT(s, i, length, c);
        buffer.append(c, getCC(c));
    }
    if(buffer.didReorder()) {
        buffer.toString(mapping);
    }
}